

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

void Am_Insert_Char_At_Cursor(Am_Object *text,char c,bool advance_cursor)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  Am_Object local_70;
  Am_String local_68;
  char *local_60;
  char *new_str;
  int str_len;
  Am_String old_str;
  int cursor_index;
  Am_Object local_20;
  byte local_12;
  char local_11;
  bool advance_cursor_local;
  Am_Object *pAStack_10;
  char c_local;
  Am_Object *text_local;
  
  local_12 = advance_cursor;
  local_11 = c;
  pAStack_10 = text;
  Am_Object::Am_Object(&local_20,text);
  bVar1 = isJapanese(&local_20);
  Am_Object::~Am_Object(&local_20);
  if (bVar1) {
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc8,text);
    Am_Insert_JChar_At_Cursor((Am_Object *)&stack0xffffffffffffffc8,local_11,(bool)(local_12 & 1));
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc8);
  }
  else {
    pAVar3 = Am_Object::Get(text,0xad,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    if (-1 < iVar2) {
      pAVar3 = Am_Object::Get(text,0xe4,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
      if (bVar1) {
        Am_Object::Am_Object((Am_Object *)&old_str,text);
        Am_Delete_Entire_String((Am_Object *)&old_str);
        Am_Object::~Am_Object((Am_Object *)&old_str);
      }
      pAVar3 = Am_Object::Get(text,0xab,0);
      Am_String::Am_String((Am_String *)&stack0xffffffffffffffb0,pAVar3);
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb0);
      sVar5 = strlen(pcVar4);
      new_str._4_4_ = (int)sVar5;
      uVar7 = (ulong)(new_str._4_4_ + 2);
      if ((long)uVar7 < 0) {
        uVar7 = 0xffffffffffffffff;
      }
      pcVar4 = (char *)operator_new__(uVar7);
      local_60 = pcVar4;
      pcVar6 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb0);
      memcpy(pcVar4,pcVar6,(long)iVar2);
      local_60[iVar2] = local_11;
      pcVar4 = local_60 + (long)iVar2 + 1;
      pcVar6 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffb0);
      memcpy(pcVar4,pcVar6 + iVar2,(long)((new_str._4_4_ - iVar2) + 1));
      Am_String::Am_String(&local_68,local_60,false);
      Am_Object::Set(text,0xab,&local_68,0);
      Am_String::~Am_String(&local_68);
      if ((local_12 & 1) == 1) {
        Am_Object::Am_Object(&local_70,text);
        Am_Move_Cursor_Right(&local_70,1);
        Am_Object::~Am_Object(&local_70);
      }
      Am_String::~Am_String((Am_String *)&stack0xffffffffffffffb0);
    }
  }
  return;
}

Assistant:

void
Am_Insert_Char_At_Cursor(Am_Object text, char c, bool advance_cursor)
{

#ifndef _WIN32
  if (isJapanese(text)) {
    Am_Insert_JChar_At_Cursor(text, c, advance_cursor);
    return;
  }
#endif

  int cursor_index = text.Get(Am_CURSOR_INDEX);
  if (cursor_index >= 0) {
    if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
      Am_Delete_Entire_String(text);
    Am_String old_str = text.Get(Am_TEXT);
    int str_len = strlen(old_str);
    // +2 for the new character and the terminating \0
    char *new_str = new char[str_len + 2];
    memcpy(new_str, (const char *)old_str, sizeof(char) * cursor_index);
    new_str[cursor_index] = c;
    memcpy((void *)&new_str[cursor_index + 1],
           &((const char *)old_str)[cursor_index],
           // Copy the terminating \0 also
           (str_len - cursor_index + 1) * sizeof(char));
    text.Set(Am_TEXT, Am_String(new_str, false));
    if (advance_cursor == true)
      Am_Move_Cursor_Right(text, 1);
  }
}